

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

void __thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
vector_s(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
         *this,vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
               *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  pointer pvVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  size_type sVar7;
  long lVar8;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  sVar7 = other->size_;
  if (sVar7 == 0) {
    sVar7 = 0;
  }
  else {
    lVar8 = sVar7 * 0x20 + -0x10;
    do {
      pvVar3 = this->data_ptr_;
      puVar1 = (undefined8 *)((long)&(pvVar3->_M_dataplus)._M_p + lVar8);
      pvVar4 = other->data_ptr_;
      puVar2 = (undefined8 *)((long)&(pvVar4->_M_dataplus)._M_p + lVar8);
      *(undefined8 **)((long)pvVar3 + lVar8 + -0x10) = puVar1;
      puVar5 = *(undefined8 **)((long)pvVar4 + lVar8 + -0x10);
      if (puVar2 == puVar5) {
        uVar6 = puVar2[1];
        *puVar1 = *puVar2;
        puVar1[1] = uVar6;
      }
      else {
        *(undefined8 **)((long)pvVar3 + lVar8 + -0x10) = puVar5;
        *(undefined8 *)((long)&(pvVar3->_M_dataplus)._M_p + lVar8) = *puVar2;
      }
      sVar7 = sVar7 - 1;
      *(undefined8 *)((long)pvVar3 + lVar8 + -8) = *(undefined8 *)((long)pvVar4 + lVar8 + -8);
      *(undefined8 **)((long)pvVar4 + lVar8 + -0x10) = puVar2;
      *(undefined8 *)((long)pvVar4 + lVar8 + -8) = 0;
      *(undefined1 *)((long)&(pvVar4->_M_dataplus)._M_p + lVar8) = 0;
      lVar8 = lVar8 + -0x20;
    } while (sVar7 != 0);
    sVar7 = other->size_;
  }
  this->size_ = sVar7;
  return;
}

Assistant:

vector_s( vector_s&& other ) noexcept
    {
        for (auto i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(std::move(other[i]));
        }
        size_ = other.size();
    }